

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O3

void __thiscall DAGPropagator::~DAGPropagator(DAGPropagator *this)

{
  uint uVar1;
  long lVar2;
  
  (this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator._vptr_Propagator =
       (_func_int **)&PTR__DAGPropagator_0020d4a8;
  uVar1 = (this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz;
  if (0 < (int)uVar1) {
    lVar2 = 0;
    do {
      if (this->reachability[lVar2] != (Tint *)0x0) {
        operator_delete__(this->reachability[lVar2]);
        uVar1 = (this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (int)uVar1);
  }
  if (this->reachability != (Tint **)0x0) {
    operator_delete__(this->reachability);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->processed_n).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->processed_e).super__Bvector_base<std::allocator<bool>_>);
  std::vector<DAGPropagator::TrailedPredList,_std::allocator<DAGPropagator::TrailedPredList>_>::
  ~vector(&this->preds);
  std::vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>::
  ~vector(&this->succs);
  DReachabilityPropagator::~DReachabilityPropagator(&this->super_DReachabilityPropagator);
  return;
}

Assistant:

DAGPropagator::~DAGPropagator() {
	for (int i = 0; i < nbNodes(); i++) {
		delete[] reachability[i];
	}
	delete[] reachability;
}